

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# runtime.cpp
# Opt level: O0

int __thiscall acto::core::runtime_t::shutdown(runtime_t *this,int __fd,int __how)

{
  bool bVar1;
  uint uVar2;
  binding_context_t *this_00;
  reference ppoVar3;
  undefined7 extraout_var;
  undefined4 in_register_00000014;
  undefined4 in_register_00000034;
  _Node_iterator_base<acto::core::object_t_*,_false> *__y;
  _Node_iterator_base<acto::core::object_t_*,_false> local_70;
  _Node_iterator_base<acto::core::object_t_*,_false> local_68;
  const_iterator ai;
  lock_guard<std::mutex> local_50;
  lock_guard<std::mutex> g;
  actors_set actors;
  runtime_t *this_local;
  
  this_00 = (binding_context_t *)
            (anonymous)::thread_context
                      (this,CONCAT44(in_register_00000034,__fd),CONCAT44(in_register_00000014,__how)
                      );
  anon_unknown_0::binding_context_t::process_actors(this_00,true);
  std::
  unordered_set<acto::core::object_t_*,_std::hash<acto::core::object_t_*>,_std::equal_to<acto::core::object_t_*>,_std::allocator<acto::core::object_t_*>_>
  ::unordered_set((unordered_set<acto::core::object_t_*,_std::hash<acto::core::object_t_*>,_std::equal_to<acto::core::object_t_*>,_std::allocator<acto::core::object_t_*>_>
                   *)&g);
  std::lock_guard<std::mutex>::lock_guard(&local_50,&this->mutex_);
  ai.super__Node_iterator_base<acto::core::object_t_*,_false>._M_cur._0_1_ =
       std::
       unordered_set<acto::core::object_t_*,_std::hash<acto::core::object_t_*>,_std::equal_to<acto::core::object_t_*>,_std::allocator<acto::core::object_t_*>_>
       ::empty(&this->actors_);
  if (!ai.super__Node_iterator_base<acto::core::object_t_*,_false>._M_cur._0_1_) {
    std::
    unordered_set<acto::core::object_t_*,_std::hash<acto::core::object_t_*>,_std::equal_to<acto::core::object_t_*>,_std::allocator<acto::core::object_t_*>_>
    ::operator=((unordered_set<acto::core::object_t_*,_std::hash<acto::core::object_t_*>,_std::equal_to<acto::core::object_t_*>,_std::allocator<acto::core::object_t_*>_>
                 *)&g,&this->actors_);
  }
  ai.super__Node_iterator_base<acto::core::object_t_*,_false>._M_cur._1_3_ = 0;
  std::lock_guard<std::mutex>::~lock_guard(&local_50);
  if ((uint)ai.super__Node_iterator_base<acto::core::object_t_*,_false>._M_cur == 0) {
    local_68._M_cur =
         (__node_type *)
         std::
         unordered_set<acto::core::object_t_*,_std::hash<acto::core::object_t_*>,_std::equal_to<acto::core::object_t_*>,_std::allocator<acto::core::object_t_*>_>
         ::cbegin((unordered_set<acto::core::object_t_*,_std::hash<acto::core::object_t_*>,_std::equal_to<acto::core::object_t_*>,_std::allocator<acto::core::object_t_*>_>
                   *)&g);
    while( true ) {
      local_70._M_cur =
           (__node_type *)
           std::
           unordered_set<acto::core::object_t_*,_std::hash<acto::core::object_t_*>,_std::equal_to<acto::core::object_t_*>,_std::allocator<acto::core::object_t_*>_>
           ::cend((unordered_set<acto::core::object_t_*,_std::hash<acto::core::object_t_*>,_std::equal_to<acto::core::object_t_*>,_std::allocator<acto::core::object_t_*>_>
                   *)&g);
      __y = &local_70;
      bVar1 = std::__detail::operator==(&local_68,__y);
      if (((bVar1 ^ 0xffU) & 1) == 0) break;
      ppoVar3 = std::__detail::_Node_const_iterator<acto::core::object_t_*,_true,_false>::operator*
                          ((_Node_const_iterator<acto::core::object_t_*,_true,_false> *)&local_68);
      deconstruct_object(this,*ppoVar3);
      std::__detail::_Node_const_iterator<acto::core::object_t_*,_true,_false>::operator++
                ((_Node_const_iterator<acto::core::object_t_*,_true,_false> *)&local_68);
    }
    event::wait(&this->no_actors_event_,__y);
    ai.super__Node_iterator_base<acto::core::object_t_*,_false>._M_cur._0_4_ = 0;
  }
  std::
  unordered_set<acto::core::object_t_*,_std::hash<acto::core::object_t_*>,_std::equal_to<acto::core::object_t_*>,_std::allocator<acto::core::object_t_*>_>
  ::~unordered_set((unordered_set<acto::core::object_t_*,_std::hash<acto::core::object_t_*>,_std::equal_to<acto::core::object_t_*>,_std::allocator<acto::core::object_t_*>_>
                    *)&g);
  uVar2 = (uint)ai.super__Node_iterator_base<acto::core::object_t_*,_false>._M_cur;
  if ((uint)ai.super__Node_iterator_base<acto::core::object_t_*,_false>._M_cur == 0) {
    bVar1 = std::
            unordered_set<acto::core::object_t_*,_std::hash<acto::core::object_t_*>,_std::equal_to<acto::core::object_t_*>,_std::allocator<acto::core::object_t_*>_>
            ::empty(&this->actors_);
    uVar2 = (uint)CONCAT71(extraout_var,bVar1);
    if (!bVar1) {
      __assert_fail("actors_.empty()",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/artpaul[P]acto/src/runtime.cpp"
                    ,0x137,"void acto::core::runtime_t::shutdown()");
    }
  }
  return uVar2;
}

Assistant:

void runtime_t::shutdown() {
  // Process all messages for binded actors and stop them.
  thread_context.process_actors(true);

  // Process shared actors.
  {
    actors_set actors;

    {
      std::lock_guard<std::mutex> g(mutex_);

      if (actors_.empty()) {
        return;
      } else {
        actors = actors_;
      }
    }

    for (auto ai = actors.cbegin(); ai != actors.cend(); ++ai) {
      deconstruct_object(*ai);
    }

    no_actors_event_.wait();
  }

  assert(actors_.empty());
}